

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

bool str2num(SQChar *s,SQObjectPtr *res,SQInteger base)

{
  SQUnsignedInteger *pSVar1;
  byte bVar2;
  bool bVar3;
  byte *pbVar4;
  longlong lVar5;
  double dVar6;
  SQChar *end;
  SQChar *local_28;
  
  pbVar4 = (byte *)s;
  do {
    bVar2 = *pbVar4;
    if (bVar2 == 0) {
      lVar5 = strtoll(s,&local_28,(int)base);
      if (local_28 == s) goto LAB_00133c01;
      if (((res->super_SQObject)._type & 0x8000000) != 0) {
        pSVar1 = &(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                  super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
            super_SQRefCounted._vptr_SQRefCounted[2])();
        }
      }
      (res->super_SQObject)._type = OT_INTEGER;
      (res->super_SQObject)._unVal.nInteger = lVar5;
      goto LAB_00133bfd;
    }
  } while ((bVar2 != 0x2e) && (pbVar4 = pbVar4 + 1, (bVar2 & 0xdf) != 0x45 || 0xd < base));
  dVar6 = strtod(s,&local_28);
  if (local_28 == s) {
LAB_00133c01:
    bVar3 = false;
  }
  else {
    if (((res->super_SQObject)._type & 0x8000000) != 0) {
      pSVar1 = &(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(((res->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
          super_SQRefCounted._vptr_SQRefCounted[2])();
      }
    }
    (res->super_SQObject)._type = OT_FLOAT;
    (res->super_SQObject)._unVal.pTable = (SQTable *)0x0;
    (res->super_SQObject)._unVal.fFloat = (float)dVar6;
LAB_00133bfd:
    bVar3 = true;
  }
  return bVar3;
}

Assistant:

static bool str2num(const SQChar *s,SQObjectPtr &res,SQInteger base)
{
    SQChar *end;
    const SQChar *e = s;
    bool iseintbase = base > 13; //to fix error converting hexadecimals with e like 56f0791e
    bool isfloat = false;
    SQChar c;
    while((c = *e) != _SC('\0'))
    {
        if (c == _SC('.') || (!iseintbase && (c == _SC('E') || c == _SC('e')))) { //e and E is for scientific notation
            isfloat = true;
            break;
        }
        e++;
    }
    if(isfloat){
        SQFloat r = SQFloat(scstrtod(s,&end));
        if(s == end) return false;
        res = r;
    }
    else{
        SQInteger r = SQInteger(scstrtol(s,&end,(int)base));
        if(s == end) return false;
        res = r;
    }
    return true;
}